

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::getEDDHPublicKey
          (SoftHSM *this,EDPublicKey *publicKey,EDPrivateKey *privateKey,ByteString *pubData)

{
  undefined8 uVar1;
  long *in_RDX;
  long *in_RSI;
  ByteString *in_RDI;
  ByteString data;
  undefined1 local_50 [56];
  long *local_18;
  SoftHSM *in_stack_fffffffffffffff8;
  CK_RV CVar2;
  
  if (in_RSI == (long *)0x0) {
    CVar2 = 7;
  }
  else if (in_RDX == (long *)0x0) {
    CVar2 = 7;
  }
  else {
    local_18 = in_RSI;
    uVar1 = (**(code **)(*in_RDX + 0x60))();
    (**(code **)(*in_RSI + 0x38))(in_RSI,uVar1);
    getECDHPubData(in_stack_fffffffffffffff8,in_RDI);
    (**(code **)(*local_18 + 0x40))(local_18,local_50);
    CVar2 = 0;
    ByteString::~ByteString((ByteString *)0x197286);
  }
  return CVar2;
}

Assistant:

CK_RV SoftHSM::getEDDHPublicKey(EDPublicKey* publicKey, EDPrivateKey* privateKey, ByteString& pubData)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;

	// Copy Domain Parameters from Private Key
	publicKey->setEC(privateKey->getEC());

	// Set value
	ByteString data = getECDHPubData(pubData);
	publicKey->setA(data);

	return CKR_OK;
}